

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::BackgroundMarkWeakRefs(Recycler *this)

{
  code *pcVar1;
  Type this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type node;
  Type *pTVar4;
  RecyclerWeakReferenceRegionItem<void_*> *pRVar5;
  RecyclerWeakReferenceRegionItem<void_*> *pRVar6;
  RecyclerWeakReferenceRegionItem<void_*> *pRVar7;
  HeapBlock *pHVar8;
  ulong uVar9;
  RecyclerWeakReferenceRegionItem<void_*> *item;
  size_t index;
  size_t count;
  RecyclerWeakReferenceRegionItem<void_*> *items;
  RecyclerWeakReferenceRegion region;
  Iterator iterator;
  Recycler *this_local;
  
  join_0x00000010_0x00000000_ =
       SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::GetIterator
                 (&(this->weakReferenceRegionList).
                   super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
                 );
  do {
    if (iterator.list ==
        (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = region.arrayHeapBlock;
    node = SListNodeBase<Memory::HeapAllocator>::Next
                     (&(iterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
    bVar2 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::IsHead
                      ((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>
                        *)this_00,node);
    if (bVar2) {
      return;
    }
    SListNodeBase<Memory::HeapAllocator>::Next
              (&(iterator.list)->super_SListNodeBase<Memory::HeapAllocator>);
    pTVar4 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
             Iterator::Data((Iterator *)&region.arrayHeapBlock);
    items = pTVar4->ptr;
    region.ptr = (Type)pTVar4->count;
    region.count = (Type)pTVar4->arrayHeapBlock;
    pRVar5 = RecyclerWeakReferenceRegion::GetPtr((RecyclerWeakReferenceRegion *)&items);
    pRVar6 = (RecyclerWeakReferenceRegionItem<void_*> *)
             RecyclerWeakReferenceRegion::GetCount((RecyclerWeakReferenceRegion *)&items);
    for (item = (RecyclerWeakReferenceRegionItem<void_*> *)0x0; item < pRVar6; item = item + 1) {
      pRVar7 = pRVar5 + (long)item * 0x10;
      if ((*(long *)pRVar7 != 0) && ((*(ulong *)(pRVar7 + 8) & 1) != 1)) {
        if (*(long *)(pRVar7 + 8) == 0) {
          pHVar8 = FindHeapBlock(this,*(void **)pRVar7);
          *(HeapBlock **)(pRVar7 + 8) = pHVar8;
          if (*(long *)(pRVar7 + 8) == 0) goto LAB_009a63f5;
        }
        uVar9 = (**(code **)(**(long **)(pRVar7 + 8) + 0x58))
                          (*(long **)(pRVar7 + 8),*(long *)pRVar7);
        if ((uVar9 & 1) != 0) {
          *(ulong *)(pRVar7 + 8) = *(ulong *)(pRVar7 + 8) | 1;
        }
      }
LAB_009a63f5:
    }
  } while( true );
}

Assistant:

void
Recycler::BackgroundMarkWeakRefs()
{
#if ENABLE_WEAK_REFERENCE_REGIONS
    auto iterator = this->weakReferenceRegionList.GetIterator();
    while (iterator.Next())
    {
        RecyclerWeakReferenceRegion region = iterator.Data();
        RecyclerWeakReferenceRegionItem<void*> *items = region.GetPtr();
        size_t count = region.GetCount();
        for (size_t index = 0; index < count; ++index)
        {
            RecyclerWeakReferenceRegionItem<void*> &item = items[index];
            if (item.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)item.heapBlock & 0x1) == 0x1)
            {
                // This weak reference is already marked
                continue;
            }

            if (item.heapBlock == nullptr)
            {
                item.heapBlock = this->FindHeapBlock(item.ptr);
                if (item.heapBlock == nullptr)
                {
                    // This isn't a real weak reference, ignore it
                    continue;
                }
            }

            if (item.heapBlock->TestObjectMarkedBit(item.ptr))
            {
                item.heapBlock = (HeapBlock*) ((uintptr_t)item.heapBlock | 0x1);
            }
        }
    }
#endif
}